

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  size_t __n;
  RGBColorSpace *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  const_iterator cVar9;
  RGBIlluminantSpectrum *this_00;
  ulong uVar10;
  ulong *puVar11;
  int iVar12;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar13;
  char *pcVar14;
  long *in_R8;
  polymorphic_allocator<pbrt::ParsedParameter_*> pVar15;
  long *plVar16;
  pointer pcVar17;
  SpectrumHandle s;
  ParameterDictionary *local_88;
  RGB local_60;
  long *local_50;
  _Base_ptr local_48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *local_40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_00000014,spectrumType);
  iVar12 = (int)alloc.memoryResource;
  if (iVar12 == 1) {
    local_40 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                *)(name->_M_string_length + 0x60);
  }
  else if (iVar12 == 0) {
    local_40 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                *)(name->_M_string_length + 0x30);
  }
  else {
    local_40 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                *)(name->_M_string_length + 0x90);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar17 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar17 = *(pointer *)(pcVar1 + 8);
  }
  if (lVar2 == 0) {
    local_88 = (ParameterDictionary *)0x0;
  }
  else {
    local_88 = this->dict;
    local_48 = &(local_40->_M_impl).super__Rb_tree_header._M_header;
    lVar13 = 0;
    local_50 = in_R8;
    do {
      pcVar3 = *(char **)(pcVar17 + lVar13);
      __n = *(size_t *)(pcVar3 + 0x28);
      iVar8 = 3;
      if ((__n == args->_M_string_length) &&
         ((args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pcVar3 + 0x20), __n == 0 ||
          (iVar7 = bcmp((args_1->_M_dataplus)._M_p,(args->_M_dataplus)._M_p,__n), iVar8 = 3,
          iVar7 == 0)))) {
        iVar8 = std::__cxx11::string::compare(pcVar3);
        if (iVar8 == 0) {
          if (*(long *)(pcVar3 + 0x90) != 1) {
            if (*(long *)(pcVar3 + 0x90) == 0) {
              this->dict = local_88;
              pcVar14 = "No texture name provided for parameter \"%s\".";
            }
            else {
              this->dict = local_88;
              pcVar14 = "More than one texture name provided for parameter \"%s\".";
            }
            ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar14,args);
          }
          pcVar3[0xb8] = '\x01';
          cVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                  ::find(local_40,*(key_type **)(pcVar3 + 0x80));
          if (cVar9._M_node == local_48) {
            this->dict = local_88;
            ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),
                       "Couldn\'t find spectrum texture named \"%s\" for parameter \"%s\"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pcVar3 + 0x80),args_1);
          }
          local_88 = *(ParameterDictionary **)(cVar9._M_node + 2);
        }
        else {
          iVar8 = std::__cxx11::string::compare(pcVar3);
          plVar16 = local_50;
          if (iVar8 == 0) {
            if (*(long *)(pcVar3 + 0x70) != 3) {
              this->dict = local_88;
              pcVar14 = "Didn\'t find three values for \"rgb\" parameter \"%s\".";
              goto LAB_00397687;
            }
            pcVar3[0xb8] = '\x01';
            local_60.b = (Float)*(double *)(*(undefined1 (**) [16])(pcVar3 + 0x60))[1];
            auVar5 = vcvtpd2ps_avx(**(undefined1 (**) [16])(pcVar3 + 0x60));
            local_60._0_8_ = vmovlps_avx(auVar5);
            if (0.0 <= auVar5._0_4_) {
              auVar6 = vmovshdup_avx(auVar5);
              if ((0.0 <= auVar6._0_4_) && (0.0 <= local_60.b)) {
                if (iVar12 == 2) {
                  pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
                  this_00 = (RGBIlluminantSpectrum *)
                            (**(code **)(*local_50 + 0x10))(local_50,0x18,8);
                  RGBIlluminantSpectrum::RGBIlluminantSpectrum(this_00,pRVar4,&local_60);
                  uVar10 = 0x6000000000000;
                }
                else if (iVar12 == 1) {
                  pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
                  this_00 = (RGBIlluminantSpectrum *)
                            (**(code **)(*local_50 + 0x10))(local_50,0x10,4);
                  RGBUnboundedSpectrum::RGBUnboundedSpectrum
                            ((RGBUnboundedSpectrum *)this_00,pRVar4,&local_60);
                  uVar10 = 0x5000000000000;
                }
                else {
                  if (iVar12 != 0) {
                    this->dict = local_88;
                    LogFatal<char_const(&)[37]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                               ,0x34e,"Check failed: %s",
                               (char (*) [37])"spectrumType == SpectrumType::Albedo");
                  }
                  if (((1.0 < auVar5._0_4_) || (1.0 < auVar6._0_4_)) || (1.0 < local_60.b)) {
                    this->dict = local_88;
                    pcVar14 = "RGB parameter \"%s\" used as an albedo has > 1 component.";
                    goto LAB_00397687;
                  }
                  pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
                  this_00 = (RGBIlluminantSpectrum *)(**(code **)(*local_50 + 0x10))(local_50,0xc,4)
                  ;
                  RGBAlbedoSpectrum::RGBAlbedoSpectrum
                            ((RGBAlbedoSpectrum *)this_00,pRVar4,&local_60);
                  uVar10 = 0x4000000000000;
                }
                pVar15.memoryResource = (memory_resource *)((ulong)this_00 | uVar10);
                goto LAB_00397544;
              }
            }
            this->dict = local_88;
            pcVar14 = "Negative value provided for RGB parameter \"%s\".";
LAB_00397687:
            ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar14,args_1);
          }
          iVar8 = std::__cxx11::string::compare(pcVar3);
          if (iVar8 != 0) {
            iVar7 = std::__cxx11::string::compare(pcVar3);
            iVar8 = 0;
            if (iVar7 != 0) goto LAB_0039757a;
          }
          plVar16 = local_50;
          local_60.r = 0.0;
          local_60.g = 0.0;
          ParameterDictionary::GetOneSpectrum
                    ((ParameterDictionary *)&stack0xffffffffffffffc8,
                     (string *)(name->_M_dataplus)._M_p,(SpectrumHandle *)args,
                     (SpectrumType)&local_60,
                     (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
          pVar15.memoryResource = local_38.memoryResource;
          if (local_38.memoryResource == (memory_resource *)0x0) {
            this->dict = local_88;
            LogFatal<char_const(&)[13]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                       ,0x358,"Check failed: %s",(char (*) [13])0x583f68);
          }
LAB_00397544:
          puVar11 = (ulong *)(**(code **)(*plVar16 + 0x10))(plVar16,8,8);
          *puVar11 = (ulong)pVar15.memoryResource;
          local_88 = (ParameterDictionary *)((ulong)puVar11 | 0x5000000000000);
        }
        iVar8 = 1;
      }
LAB_0039757a:
      if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_003975a8;
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
    local_88 = (ParameterDictionary *)0x0;
  }
LAB_003975a8:
  this->dict = local_88;
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )this;
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    const auto &spectrumTextures = (spectrumType == SpectrumType::Unbounded)
                                       ? textures->unboundedSpectrumTextures
                                       : ((spectrumType == SpectrumType::Albedo)
                                              ? textures->albedoSpectrumTextures
                                              : textures->illuminantSpectrumTextures);

    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures.find(p->strings[0]);
            if (iter != spectrumTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc, "Negative value provided for RGB parameter \"%s\".",
                          p->name);
            SpectrumHandle s;
            if (spectrumType == SpectrumType::Illuminant)
                s = alloc.new_object<RGBIlluminantSpectrum>(*dict->ColorSpace(), rgb);
            else if (spectrumType == SpectrumType::Unbounded)
                s = alloc.new_object<RGBUnboundedSpectrum>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Albedo);
                if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                    ErrorExit(&p->loc,
                              "RGB parameter \"%s\" used as an albedo has > 1 component.",
                              p->name);
                s = alloc.new_object<RGBAlbedoSpectrum>(*dict->ColorSpace(), rgb);
            }
            return alloc.new_object<SpectrumConstantTexture>(s);
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}